

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Partial.cpp
# Opt level: O3

bool __thiscall
MT32Emu::Partial::generateNextSample<MT32Emu::LA32IntPartialPair>
          (Partial *this,LA32IntPartialPair *la32PairImpl)

{
  bool bVar1;
  Bit16u BVar2;
  Bit32u BVar3;
  Bit32u BVar4;
  
  bVar1 = TVA::isPlaying(this->tva);
  if ((bVar1) && (bVar1 = LA32IntPartialPair::isActive(la32PairImpl,MASTER), bVar1)) {
    BVar3 = getAmpValue(this);
    BVar2 = TVP::nextPitch(this->tvp);
    BVar4 = getCutoffValue(this);
    LA32IntPartialPair::generateNextSample(la32PairImpl,MASTER,BVar3,BVar2,BVar4);
    if (this->pair == (Partial *)0x0) {
      return true;
    }
    if (this->structurePosition != 0) {
      return true;
    }
    if (1 < this->mixType - 1U) {
      return true;
    }
    BVar3 = getAmpValue(this->pair);
    BVar2 = TVP::nextPitch(this->pair->tvp);
    BVar4 = getCutoffValue(this->pair);
    LA32IntPartialPair::generateNextSample(la32PairImpl,SLAVE,BVar3,BVar2,BVar4);
    bVar1 = TVA::isPlaying(this->pair->tva);
    if ((bVar1) && (bVar1 = LA32IntPartialPair::isActive(la32PairImpl,SLAVE), bVar1)) {
      return true;
    }
    deactivate(this->pair);
    if (this->mixType != 2) {
      return true;
    }
  }
  deactivate(this);
  return false;
}

Assistant:

bool Partial::generateNextSample(LA32PairImpl *la32PairImpl) {
	if (!tva->isPlaying() || !la32PairImpl->isActive(LA32PartialPair::MASTER)) {
		deactivate();
		return false;
	}
	la32PairImpl->generateNextSample(LA32PartialPair::MASTER, getAmpValue(), tvp->nextPitch(), getCutoffValue());
	if (hasRingModulatingSlave()) {
		la32PairImpl->generateNextSample(LA32PartialPair::SLAVE, pair->getAmpValue(), pair->tvp->nextPitch(), pair->getCutoffValue());
		if (!pair->tva->isPlaying() || !la32PairImpl->isActive(LA32PartialPair::SLAVE)) {
			pair->deactivate();
			if (mixType == 2) {
				deactivate();
				return false;
			}
		}
	}
	return true;
}